

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriter.cpp
# Opt level: O3

ssize_t __thiscall
ApprovalTests::StringWriter::write(StringWriter *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  ssize_t sVar2;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  ofstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long local_220;
  filebuf local_218 [24];
  byte abStack_200 [216];
  ios_base local_128 [264];
  
  ::std::ofstream::ofstream
            (&local_220,
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(in_register_00000034,__fd))->_M_dataplus)._M_p,_S_out);
  if ((abStack_200[*(long *)(local_220 + -0x18)] & 5) == 0) {
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_220,(this->s)._M_dataplus._M_p,(this->s)._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    ::std::ofstream::close();
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _strftime;
    ::std::filebuf::~filebuf(local_218);
    sVar2 = ::std::ios_base::~ios_base(local_128);
    return sVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_240,"Unable to write file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_register_00000034,__fd));
  ::std::runtime_error::runtime_error(this_00,(string *)&local_240);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void StringWriter::write(std::string path) const
    {
        std::ofstream out(path.c_str(), std::ofstream::out);
        if (!out)
        {
            throw std::runtime_error("Unable to write file: " + path);
        }
        this->Write(out);
        out.close();
    }